

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildInt32x4_4
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot)

{
  code *pcVar1;
  bool bVar2;
  OpCode opcode;
  RegOpnd *pRVar3;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *this_00;
  undefined4 *puVar4;
  Instr *pIVar5;
  
  pRVar3 = BuildSrcOpnd(this,src1RegSlot,TySimd128I4);
  IR::Opnd::SetValueType(&pRVar3->super_Opnd,(ValueType)0x4000);
  src1 = BuildSrcOpnd(this,src2RegSlot,TySimd128I4);
  IR::Opnd::SetValueType(&src1->super_Opnd,(ValueType)0x4000);
  src1_00 = BuildSrcOpnd(this,src3RegSlot,TySimd128I4);
  IR::Opnd::SetValueType(&src1->super_Opnd,(ValueType)0x4000);
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128I4);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  opcode = GetSimdOpcode(this,newOpcode);
  if (opcode == EndOfBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xff9,"((uint32)opcode)","Invalid backend SIMD opcode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar5 = AddExtendedArg(this,pRVar3,(RegOpnd *)0x0,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar5->m_dst);
  pIVar5 = AddExtendedArg(this,src1,pRVar3,offset);
  pRVar3 = IR::Opnd::AsRegOpnd(pIVar5->m_dst);
  pIVar5 = AddExtendedArg(this,src1_00,pRVar3,offset);
  pIVar5 = IR::Instr::New(opcode,&this_00->super_Opnd,pIVar5->m_dst,this->m_func);
  AddInstr(this,pIVar5,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt32x4_4(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG4)
{
    ValueType valueType = GetSimdValueTypeFromIRType(TySimd128I4);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128I4);
    src1Opnd->SetValueType(valueType);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TySimd128I4);
    src2Opnd->SetValueType(valueType);

    IR::RegOpnd * mask = BuildSrcOpnd(src3RegSlot, TySimd128I4);
    src2Opnd->SetValueType(valueType);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I4);
    dstOpnd->SetValueType(GetSimdValueTypeFromIRType(TySimd128I4));

    Js::OpCode opcode;

    opcode = GetSimdOpcode(newOpcode);

    AssertMsg((uint32)opcode, "Invalid backend SIMD opcode");

    IR::Instr* instr = nullptr;

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(mask, instr->GetDst()->AsRegOpnd(), offset);

    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}